

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O2

int hardware_PWM(uint gpio,uint frequency,uint32_t dutycycle)

{
  int iVar1;
  uint32_t dutycycle_local;
  gpioExtent_t ext [1];
  
  ext[0].ptr = &dutycycle_local;
  ext[0].size = 4;
  dutycycle_local = dutycycle;
  iVar1 = pigpio_command_ext(gPigCommand,0x56,gpio,frequency,4,1,ext,1);
  return iVar1;
}

Assistant:

int hardware_PWM(unsigned gpio, unsigned frequency, uint32_t dutycycle)
{
   gpioExtent_t ext[1];
   
   /*
   p1=gpio
   p2=frequency
   p3=4
   ## extension ##
   uint32_t dutycycle
   */

   ext[0].size = sizeof(dutycycle);
   ext[0].ptr = &dutycycle;

   return pigpio_command_ext(
      gPigCommand, PI_CMD_HP, gpio, frequency, sizeof(dutycycle), 1, ext, 1);
}